

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::BuildCommandLine
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *cmdLines,string *customStep,cmGeneratorTarget *target)

{
  pointer pbVar1;
  const_iterator __begin2;
  pointer pbVar2;
  size_t sVar3;
  string *source;
  ulong uVar4;
  cmCryptoHash hash;
  ostringstream cmd;
  string local_1f8;
  cmCryptoHash local_1d8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  pbVar2 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar1 = (cmdLines->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar2 == pbVar1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,
               cmGlobalNinjaGenerator::SHELL_NOOP_abi_cxx11_._M_dataplus._M_p,
               cmGlobalNinjaGenerator::SHELL_NOOP_abi_cxx11_._M_dataplus._M_p +
               cmGlobalNinjaGenerator::SHELL_NOOP_abi_cxx11_._M_string_length);
  }
  else {
    if (customStep->_M_string_length != 0) {
      uVar4 = 0;
      do {
        uVar4 = uVar4 + pbVar2->_M_string_length + 6;
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 != pbVar1);
      sVar3 = cmSystemTools::CalculateCommandLineLengthLimit();
      if (sVar3 >> 1 < uVar4) {
        WriteCommandScript((string *)local_1a8,this,cmdLines,customStep,target);
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)__return_storage_ptr__,"/bin/sh ","");
        source = cmGlobalNinjaGenerator::ConvertToNinjaPath
                           ((cmGlobalNinjaGenerator *)
                            (this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                            GlobalGenerator,(string *)local_1a8);
        cmOutputConverter::ConvertToOutputFormat
                  (&local_1f8,
                   &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,source,SHELL);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)__return_storage_ptr__);
        cmCryptoHash::cmCryptoHash(&local_1d8,AlgoSHA256);
        cmCryptoHash::HashFile(&local_1c8,&local_1d8,(string *)local_1a8);
        std::__cxx11::string::substr((ulong)&local_1f8,(ulong)&local_1c8);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_1f8._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
          operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        cmCryptoHash::~cmCryptoHash(&local_1d8);
        if ((undefined1 *)local_1a8._0_8_ == local_1a8 + 0x10) {
          return __return_storage_ptr__;
        }
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        return __return_storage_ptr__;
      }
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    pbVar2 = (cmdLines->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if (pbVar2 != (cmdLines->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        if (pbVar2 != (cmdLines->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," && ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pbVar2->_M_dataplus)._M_p,pbVar2->_M_string_length);
        pbVar2 = pbVar2 + 1;
      } while (pbVar2 != (cmdLines->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::BuildCommandLine(
  std::vector<std::string> const& cmdLines, std::string const& customStep,
  cmGeneratorTarget const* target) const
{
  // If we have no commands but we need to build a command anyway, use noop.
  // This happens when building a POST_BUILD value for link targets that
  // don't use POST_BUILD.
  if (cmdLines.empty()) {
    return cmGlobalNinjaGenerator::SHELL_NOOP;
  }

  // If this is a custom step then we will have no '$VAR' ninja placeholders.
  // This means we can deal with long command sequences by writing to a script.
  // Do this if the command lines are on the scale of the OS limit.
  if (!customStep.empty()) {
    size_t cmdLinesTotal = 0;
    for (std::string const& cmd : cmdLines) {
      cmdLinesTotal += cmd.length() + 6;
    }
    if (cmdLinesTotal > cmSystemTools::CalculateCommandLineLengthLimit() / 2) {
      std::string const scriptPath =
        this->WriteCommandScript(cmdLines, customStep, target);
      std::string cmd
#ifndef _WIN32
        = "/bin/sh "
#endif
        ;
      cmd += this->ConvertToOutputFormat(
        this->GetGlobalNinjaGenerator()->ConvertToNinjaPath(scriptPath),
        cmOutputConverter::SHELL);

      // Add an unused argument based on script content so that Ninja
      // knows when the command lines change.
      cmd += " ";
      cmCryptoHash hash(cmCryptoHash::AlgoSHA256);
      cmd += hash.HashFile(scriptPath).substr(0, 16);
      return cmd;
    }
  }

  std::ostringstream cmd;
  for (std::vector<std::string>::const_iterator li = cmdLines.begin();
       li != cmdLines.end(); ++li)
#ifdef _WIN32
  {
    if (li != cmdLines.begin()) {
      cmd << " && ";
    } else if (cmdLines.size() > 1) {
      cmd << "cmd.exe /C \"";
    }
    // Put current cmdLine in brackets if it contains "||" because it has
    // higher precedence than "&&" in cmd.exe
    if (li->find("||") != std::string::npos) {
      cmd << "( " << *li << " )";
    } else {
      cmd << *li;
    }
  }
  if (cmdLines.size() > 1) {
    cmd << "\"";
  }
#else
  {
    if (li != cmdLines.begin()) {
      cmd << " && ";
    }
    cmd << *li;
  }
#endif
  return cmd.str();
}